

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O3

void __thiscall rst::Parser::ParseBlock(Parser *this,BlockType type,BlockType *prev_type,int indent)

{
  byte bVar1;
  bool bVar2;
  BlockType *prev_type_00;
  long lVar3;
  int indent_00;
  long lVar4;
  byte *pbVar5;
  char *s;
  byte *pbVar6;
  char cVar7;
  ulong uVar8;
  string text;
  undefined1 *local_60;
  ulong local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  BlockType *local_40;
  long local_38;
  
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  local_38 = (long)indent;
  pbVar6 = (byte *)this->ptr_;
  bVar2 = true;
  local_40 = prev_type;
  do {
    lVar3 = local_38;
    if (!bVar2) {
      while( true ) {
        bVar1 = *pbVar6;
        if ((0x20 < (ulong)bVar1) || ((0x100001a00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
        pbVar6 = pbVar6 + 1;
        this->ptr_ = (char *)pbVar6;
        lVar3 = lVar3 + -1;
      }
      if ((lVar3 != 0) || (bVar1 == 0)) goto LAB_00132ca4;
      if (bVar1 == 10) break;
    }
    lVar3 = 0;
    lVar4 = 0;
    pbVar5 = pbVar6;
    while ((*pbVar5 != 0 && (*pbVar5 != 10))) {
      pbVar5 = pbVar5 + 1;
      this->ptr_ = (char *)pbVar5;
      lVar4 = lVar4 + -1;
      lVar3 = lVar3 + 1;
    }
    while (pbVar5 = pbVar6, lVar4 != 0) {
      if ((0x20 < (ulong)pbVar6[lVar3 + -1]) ||
         ((0x100001a00U >> ((ulong)pbVar6[lVar3 + -1] & 0x3f) & 1) == 0)) {
        pbVar5 = pbVar6 + lVar3;
        break;
      }
      lVar3 = lVar3 + -1;
      lVar4 = lVar3;
    }
    std::__cxx11::string::reserve((ulong)&local_60);
    cVar7 = (char)&local_60;
    if (!bVar2) {
      std::__cxx11::string::push_back(cVar7);
    }
    for (; pbVar6 != pbVar5; pbVar6 = pbVar6 + 1) {
      bVar1 = *pbVar6;
      if (((bVar1 - 0xb < 2) || (bVar1 == 0x20)) || (bVar1 != 9)) {
        std::__cxx11::string::push_back(cVar7);
      }
      else {
        std::__cxx11::string::append((char *)&local_60,0x136cf9);
      }
    }
    pbVar6 = (byte *)this->ptr_;
    bVar2 = false;
    if (*pbVar6 == 10) {
      pbVar6 = pbVar6 + 1;
      this->ptr_ = (char *)pbVar6;
      bVar2 = false;
    }
  } while( true );
  this->ptr_ = (char *)(pbVar6 + 1);
LAB_00132ca4:
  if (local_60[local_58 - 1] == '\n') {
    std::__cxx11::string::resize((ulong)&local_60,(char)local_58 + -1);
  }
  prev_type_00 = local_40;
  if ((((local_58 < 2 || type != PARAGRAPH) || (local_60[local_58 - 2] != ':')) ||
      (local_60[local_58 - 1] != ':')) || (local_60[local_58] != '\0')) {
    bVar2 = false;
    uVar8 = local_58;
LAB_00132d14:
    EnterBlock(this,local_40,type);
    (*this->handler_->_vptr_ContentHandler[2])(this->handler_,(ulong)type);
    (*this->handler_->_vptr_ContentHandler[4])(this->handler_,local_60,uVar8);
    (*this->handler_->_vptr_ContentHandler[3])();
    if (!bVar2) goto LAB_00132d8b;
  }
  else if (local_58 != 2) {
    uVar8 = local_58 - 1;
    bVar2 = true;
    goto LAB_00132d14;
  }
  indent_00 = 0;
  pbVar6 = (byte *)this->ptr_;
  while( true ) {
    if ((0x20 < (ulong)*pbVar6) || ((0x100001a00U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) break;
    this->ptr_ = (char *)(pbVar6 + 1);
    indent_00 = indent_00 + 1;
    pbVar6 = pbVar6 + 1;
  }
  if (indent < indent_00) {
    ParseBlock(this,LITERAL_BLOCK,prev_type_00,indent_00);
  }
LAB_00132d8b:
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
}

Assistant:

void rst::Parser::ParseBlock(
    rst::BlockType type, rst::BlockType &prev_type, int indent) {
  std::string text;
  for (bool first = true; ; first = false) {
    const char *line_start = ptr_;
    if (!first) {
      // Check indentation.
      SkipSpace();
      if (ptr_ - line_start != indent)
        break;
      if (*ptr_ == '\n') {
        ++ptr_;
        break;  // Empty line ends the block.
      }
      if (!*ptr_)
        break;  // End of input.
    }
    // Strip indentation.
    line_start = ptr_;

    // Find the end of the line.
    while (*ptr_ && *ptr_ != '\n')
      ++ptr_;

    // Strip whitespace at the end of the line.
    const char *end = ptr_;
    while (end != line_start && IsSpace(end[-1]))
      --end;

    // Copy text converting all whitespace characters to spaces.
    text.reserve(end - line_start + 1);
    if (!first)
      text.push_back('\n');
    enum {TAB_WIDTH = 8};
    for (const char *s = line_start; s != end; ++s) {
      char c = *s;
      if (c == '\t') {
        text.append("        ",
            TAB_WIDTH - ((indent + s - line_start) % TAB_WIDTH));
      } else if (IsSpace(c)) {
        text.push_back(' ');
      } else {
        text.push_back(*s);
      }
    }
    if (*ptr_ == '\n')
      ++ptr_;
  }

  // Remove a trailing newline.
  if (*text.rbegin() == '\n')
    text.resize(text.size() - 1);

  bool literal = type == PARAGRAPH && EndsWith(text, "::");
  if (!literal || text.size() != 2) {
    std::size_t size = text.size();
    if (literal)
      --size;
    EnterBlock(prev_type, type);
    handler_->StartBlock(type);
    handler_->HandleText(text.c_str(), size);
    handler_->EndBlock();
  }
  if (literal) {
    // Parse a literal block.
    const char *line_start = ptr_;
    SkipSpace();
    int new_indent = static_cast<int>(ptr_ - line_start);
    if (new_indent > indent)
      ParseBlock(LITERAL_BLOCK, prev_type, new_indent);
  }
}